

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_qcx_getcompparms
              (jpc_qcxcp_t *compparms,jpc_cstate_t *cstate,jas_stream_t *in,uint_fast16_t len)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  uint_fast16_t uVar4;
  int local_3c;
  int i;
  int n;
  uint_fast8_t tmp;
  uint_fast16_t len_local;
  jas_stream_t *in_local;
  jpc_cstate_t *cstate_local;
  jpc_qcxcp_t *compparms_local;
  
  _n = len;
  len_local = (uint_fast16_t)in;
  in_local = (jas_stream_t *)cstate;
  cstate_local = (jpc_cstate_t *)compparms;
  iVar2 = jpc_getuint8(in,(uint_fast8_t *)((long)&i + 3));
  if (iVar2 == 0) {
    *(byte *)&cstate_local->numcomps = i._3_1_ & 0x1f;
    *(byte *)&cstate_local[2].numcomps = i._3_1_ >> 5;
    cVar1 = (char)cstate_local->numcomps;
    if (cVar1 == '\0') {
      *(int *)((long)&cstate_local->numcomps + 4) = (int)_n + -1;
    }
    else if (cVar1 == '\x01') {
      *(undefined4 *)((long)&cstate_local->numcomps + 4) = 1;
    }
    else if (cVar1 == '\x02') {
      *(int *)((long)&cstate_local->numcomps + 4) = (int)(_n - 1 >> 1);
    }
    if (*(int *)((long)&cstate_local->numcomps + 4) < 0x65) {
      if (*(int *)((long)&cstate_local->numcomps + 4) < 1) {
        cstate_local[1].numcomps = 0;
      }
      else {
        pvVar3 = jas_alloc2((long)*(int *)((long)&cstate_local->numcomps + 4),8);
        cstate_local[1].numcomps = (uint_fast16_t)pvVar3;
        if (pvVar3 == (void *)0x0) {
          abort();
        }
        for (local_3c = 0; local_3c < *(int *)((long)&cstate_local->numcomps + 4);
            local_3c = local_3c + 1) {
          if ((char)cstate_local->numcomps == '\0') {
            iVar2 = jpc_getuint8((jas_stream_t *)len_local,(uint_fast8_t *)((long)&i + 3));
            if (iVar2 != 0) {
              jpc_qcx_destroycompparms((jpc_qcxcp_t *)cstate_local);
              return -1;
            }
            uVar4 = JPC_QCX_EXPN((int)(uint)i._3_1_ >> 3);
            *(uint_fast16_t *)(cstate_local[1].numcomps + (long)local_3c * 8) = uVar4;
          }
          else {
            iVar2 = jpc_getuint16((jas_stream_t *)len_local,
                                  (uint_fast16_t *)(cstate_local[1].numcomps + (long)local_3c * 8));
            if (iVar2 != 0) {
              jpc_qcx_destroycompparms((jpc_qcxcp_t *)cstate_local);
              return -1;
            }
          }
        }
      }
      if (((*(uint *)(len_local + 8) & 2) == 0) && ((*(uint *)(len_local + 8) & 1) == 0)) {
        compparms_local._4_4_ = 0;
      }
      else {
        jpc_qcx_destroycompparms((jpc_qcxcp_t *)cstate_local);
        compparms_local._4_4_ = -1;
      }
    }
    else {
      jpc_qcx_destroycompparms((jpc_qcxcp_t *)cstate_local);
      compparms_local._4_4_ = -1;
    }
  }
  else {
    compparms_local._4_4_ = -1;
  }
  return compparms_local._4_4_;
}

Assistant:

static int jpc_qcx_getcompparms(jpc_qcxcp_t *compparms, jpc_cstate_t *cstate,
  jas_stream_t *in, uint_fast16_t len)
{
	uint_fast8_t tmp;
	int n;
	int i;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	n = 0;
	if (jpc_getuint8(in, &tmp)) {
		return -1;
	}
	++n;
	compparms->qntsty = tmp & 0x1f;
	compparms->numguard = (tmp >> 5) & 7;
	switch (compparms->qntsty) {
	case JPC_QCX_SIQNT:
		compparms->numstepsizes = 1;
		break;
	case JPC_QCX_NOQNT:
		compparms->numstepsizes = (len - n);
		break;
	case JPC_QCX_SEQNT:
		/* XXX - this is a hack */
		compparms->numstepsizes = (len - n) / 2;
		break;
	}
	/* Ensure that the step size array is sufficiently large. */
	if (compparms->numstepsizes > 3 * JPC_MAXRLVLS + 1) {
		jpc_qcx_destroycompparms(compparms);
		return -1;
	}
	if (compparms->numstepsizes > 0) {
		if (!(compparms->stepsizes = jas_alloc2(compparms->numstepsizes,
		  sizeof(uint_fast16_t)))) {
			abort();
		}
		for (i = 0; i < compparms->numstepsizes; ++i) {
			if (compparms->qntsty == JPC_QCX_NOQNT) {
				if (jpc_getuint8(in, &tmp)) {
					jpc_qcx_destroycompparms(compparms);
					return -1;
				}
				compparms->stepsizes[i] = JPC_QCX_EXPN(tmp >> 3);
			} else {
				if (jpc_getuint16(in, &compparms->stepsizes[i])) {
					jpc_qcx_destroycompparms(compparms);
					return -1;
				}
			}
		}
	} else {
		compparms->stepsizes = 0;
	}
	if (jas_stream_error(in) || jas_stream_eof(in)) {
		jpc_qcx_destroycompparms(compparms);
		return -1;
	}
	return 0;
}